

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::repeat(CBString *this,int count)

{
  CBStringException *this_00;
  int iVar1;
  double in_XMM0_Qa;
  allocator local_59;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  iVar1 = count * (this->super_tagbstring).slen;
  if (iVar1 == 0) {
    trunc(this,in_XMM0_Qa);
    return;
  }
  if (-1 < iVar1) {
    iVar1 = bpattern(&this->super_tagbstring,iVar1);
    if (iVar1 != -1) {
      return;
    }
  }
  std::__cxx11::string::string((string *)&local_58,"CBString::Failure in repeat",&local_59);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::repeat (int count) {
	count *= slen;
	if (count == 0) {
		trunc (0);
		return;
	}
	if (count < 0 || BSTR_ERR == bpattern (this, count)) {
		bstringThrow ("Failure in repeat");
	}
}